

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_group.hpp
# Opt level: O0

void __thiscall
oqpi::
sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
::executeImpl(sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
              *this)

{
  bool bVar1;
  undefined1 local_20 [8];
  task_handle hTask;
  sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
  *this_local;
  
  hTask.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  popTask((sequence_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
           *)local_20);
  bVar1 = task_handle::tryGrab((task_handle *)local_20);
  if (bVar1) {
    task_handle::execute((task_handle *)local_20);
  }
  task_handle::~task_handle((task_handle *)local_20);
  return;
}

Assistant:

virtual void executeImpl() override final
        {
            auto hTask = popTask();
            if (hTask.tryGrab())
            {
                hTask.execute();
            }
        }